

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Dsp.cpp
# Opt level: O0

void __thiscall Spc_Dsp::soft_reset_common(Spc_Dsp *this)

{
  Spc_Dsp *in_RDI;
  
  (in_RDI->m).noise = 0x4000;
  (in_RDI->m).echo_hist_pos = (in_RDI->m).echo_hist;
  (in_RDI->m).every_other_sample = 1;
  (in_RDI->m).echo_offset = 0;
  (in_RDI->m).phase = 0;
  init_counter(in_RDI);
  return;
}

Assistant:

void Spc_Dsp::soft_reset_common()
{
	require( m.ram ); // init() must have been called already
	
	m.noise              = 0x4000;
	m.echo_hist_pos      = m.echo_hist;
	m.every_other_sample = 1;
	m.echo_offset        = 0;
	m.phase              = 0;
	
	init_counter();
}